

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::VertexInputInstance::verifyImage
          (TestStatus *__return_storage_ptr__,VertexInputInstance *this)

{
  void **this_00;
  undefined4 queueFamilyIndex_00;
  bool bVar1;
  uint uVar2;
  uint height;
  deInt32 dVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  DeviceInterface *vk_00;
  VkDevice device;
  VkQueue queue_00;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  Handle<(vk::HandleType)9> *pHVar7;
  TestContext *this_01;
  TestLog *log;
  TextureLevel *this_02;
  allocator<char> local_671;
  string local_670;
  undefined4 local_650;
  allocator<char> local_649;
  string local_648;
  Vector<int,_3> local_624;
  Vector<unsigned_int,_4> local_618;
  ConstPixelBufferAccess local_608;
  ConstPixelBufferAccess local_5e0;
  deUint64 local_5b8;
  undefined1 local_5b0 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  undefined1 local_398 [8];
  SimpleAllocator allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  Vector<float,_4> local_148;
  Vec4 local_138;
  PixelBufferAccess local_128;
  PixelBufferAccess local_100;
  undefined1 local_d8 [8];
  PixelBufferAccess refBlueSubregion;
  PixelBufferAccess local_a0;
  undefined1 local_78 [8];
  PixelBufferAccess refRedSubregion;
  TextureLevel reference;
  TextureFormat tcuColorFormat;
  bool compareOk;
  VertexInputInstance *this_local;
  
  register0x00000000 = ::vk::mapVkFormat(this->m_colorFormat);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  height = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  this_00 = &refRedSubregion.super_ConstPixelBufferAccess.m_data;
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)this_00,(TextureFormat *)((long)&reference.m_data.m_cap + 4),uVar2,
             height,1);
  tcu::TextureLevel::getAccess(&local_a0,(TextureLevel *)this_00);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  dVar3 = deRoundFloatToInt32((float)uVar2 * 0.0);
  uVar2 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  dVar4 = deRoundFloatToInt32((float)uVar2 * 0.0);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  dVar5 = deRoundFloatToInt32((float)uVar2 * 0.5);
  uVar2 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  dVar6 = deRoundFloatToInt32((float)uVar2);
  tcu::getSubregion((PixelBufferAccess *)local_78,&local_a0,dVar3,dVar4,dVar5,dVar6);
  tcu::TextureLevel::getAccess
            (&local_100,(TextureLevel *)&refRedSubregion.super_ConstPixelBufferAccess.m_data);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  dVar3 = deRoundFloatToInt32((float)uVar2 * 0.5);
  uVar2 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  dVar4 = deRoundFloatToInt32((float)uVar2 * 0.0);
  uVar2 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  dVar5 = deRoundFloatToInt32((float)uVar2 * 0.5);
  uVar2 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  dVar6 = deRoundFloatToInt32((float)uVar2);
  tcu::getSubregion((PixelBufferAccess *)local_d8,&local_100,dVar3,dVar4,dVar5,dVar6);
  tcu::TextureLevel::getAccess
            (&local_128,(TextureLevel *)&refRedSubregion.super_ConstPixelBufferAccess.m_data);
  defaultClearColor((pipeline *)&local_138,(TextureFormat *)((long)&reference.m_data.m_cap + 4));
  tcu::clear(&local_128,&local_138);
  tcu::Vector<float,_4>::Vector(&local_148,1.0,0.0,0.0,1.0);
  tcu::clear((PixelBufferAccess *)local_78,&local_148);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vk,0.0,0.0,1.0,1.0);
  tcu::clear((PixelBufferAccess *)local_d8,(Vec4 *)&vk);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator.m_memProps.memoryHeaps[0xf]._12_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk_01 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8,vk_01,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_398,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8);
  queueFamilyIndex_00 = allocator.m_memProps.memoryHeaps[0xf]._12_4_;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_5b8 = pHVar7->m_internal;
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_5b0,vk_00,device,queue_00,queueFamilyIndex_00,(Allocator *)local_398,
                      (VkImage)local_5b8,this->m_colorFormat,&this->m_renderSize);
  this_01 = Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_01);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_5e0,
             (TextureLevel *)&refRedSubregion.super_ConstPixelBufferAccess.m_data);
  this_02 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
            operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                       local_5b0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_608,this_02);
  tcu::Vector<unsigned_int,_4>::Vector(&local_618,2,2,2,2);
  tcu::Vector<int,_3>::Vector(&local_624,1,1,0);
  bVar1 = tcu::intThresholdPositionDeviationCompare
                    (log,"IntImageCompare","Image comparison",&local_5e0,&local_608,&local_618,
                     &local_624,true,COMPARE_LOG_RESULT);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_5b0);
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_398);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_648,"Result image matches reference",&local_649);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"Image mismatch",&local_671);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
  }
  local_650 = 1;
  tcu::TextureLevel::~TextureLevel
            ((TextureLevel *)&refRedSubregion.super_ConstPixelBufferAccess.m_data);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexInputInstance::verifyImage (void)
{
	bool							compareOk			= false;
	const tcu::TextureFormat		tcuColorFormat		= mapVkFormat(m_colorFormat);
	tcu::TextureLevel				reference			(tcuColorFormat, m_renderSize.x(), m_renderSize.y());
	const tcu::PixelBufferAccess	refRedSubregion		(tcu::getSubregion(reference.getAccess(),
																		   deRoundFloatToInt32((float)m_renderSize.x() * 0.0f),
																		   deRoundFloatToInt32((float)m_renderSize.y() * 0.0f),
																		   deRoundFloatToInt32((float)m_renderSize.x() * 0.5f),
																		   deRoundFloatToInt32((float)m_renderSize.y() * 1.0f)));
	const tcu::PixelBufferAccess	refBlueSubregion	(tcu::getSubregion(reference.getAccess(),
																		   deRoundFloatToInt32((float)m_renderSize.x() * 0.5f),
																		   deRoundFloatToInt32((float)m_renderSize.y() * 0.0f),
																		   deRoundFloatToInt32((float)m_renderSize.x() * 0.5f),
																		   deRoundFloatToInt32((float)m_renderSize.y() * 1.0f)));

	// Create reference image
	tcu::clear(reference.getAccess(), defaultClearColor(tcuColorFormat));
	tcu::clear(refRedSubregion, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	tcu::clear(refBlueSubregion, tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	// Compare result with reference image
	{
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					vkDevice			= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		SimpleAllocator					allocator			(vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));
		de::MovePtr<tcu::TextureLevel>	result				= readColorAttachment(vk, vkDevice, queue, queueFamilyIndex, allocator, *m_colorImage, m_colorFormat, m_renderSize);

		compareOk = tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
															  "IntImageCompare",
															  "Image comparison",
															  reference.getAccess(),
															  result->getAccess(),
															  tcu::UVec4(2, 2, 2, 2),
															  tcu::IVec3(1, 1, 0),
															  true,
															  tcu::COMPARE_LOG_RESULT);
	}

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}